

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmsg.c
# Opt level: O2

void mess_init(void)

{
  return;
}

Assistant:

void mess_init(void) {
#ifdef MAIKO_HANDLE_CONSOLE_MESSAGES
  struct passwd *pwd;
  int ttyfd;
  int ptyfd, ptynum;
  char *ptyname, *ttyname;
  struct termios options;

  ptyname = "/dev/ptypx";
  ttyname = "/dev/ttypx";

  /* Get pty and tty */
  ptynum = 0;

needpty:
  while (ptynum < 16) {
    ptyname[9] = "0123456789abcdef"[ptynum];
    if ((ptyfd = open(ptyname, 2)) >= 0) goto gotpty;
    ptynum++;
  }
  return;
gotpty:
  ttyname[9] = ptyname[9];
  if ((ttyfd = open(ttyname, 2)) < 0) {
    ptynum++;
    close(ptyfd);
    goto needpty;
  }

  /* Set tty parameters same as stderr */
  tcgetattr(2, &options);
  tcsetattr(ttyfd, TCSANOW, &options);

  /* Get console IO */
  ioctl(ptyfd, FIOCLEX, 0);
  /* It isn't clear which platforms this #ifndef should
   * actually apply to. The AIX define used to apply
   * to a number of platforms, not just AIX-actual. */
#ifndef AIX
  if ((ioctl(ttyfd, TIOCCONS, 0)) == -1) {
    OSMESSAGE_PRINT(printf("TIOCCONS error\n"));
    exit(-1);
  }
#endif /* AIX */

  cons_pty = ptyfd;
  cons_tty = ttyfd;

  /* Initialize log file */
  pwd = getpwuid(getuid());
  sprintf(logfile, "/tmp/%s-lisp.log", pwd->pw_name);
  if (unlink(logfile) == -1) { /* delete old log file */
    if (errno != ENOENT) return;
  }

  if ((log_id = open(logfile, (O_RDWR | O_CREAT), 0666)) < 0) return;
#ifdef LOGINT
  LogFileFd = cons_pty; /* was kept as an fd_set, but doesn't need to be */
  fcntl(cons_pty, F_SETFL, fcntl(cons_pty, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
  if (fcntl(cons_pty, F_SETOWN, getpid()) == -1) {
#ifdef DEBUG
    perror("fcntl F_SETOWN of log PTY");
#endif
  }
  FD_SET(LogFileFd, &LispReadFds);
  flush_pty();
#endif
  previous_size = 0;
  DBPRINT(("Console logging started.\n"));
#endif /* MAIKO_HANDLE_CONSOLE_MESSAGES */
}